

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O0

FT_Error cff_get_advances(FT_Face face,FT_UInt start,FT_UInt count,FT_Int32 flags,FT_Fixed *advances
                         )

{
  FT_Fixed local_58;
  ushort local_4e;
  ushort local_4c;
  undefined1 local_4a [2];
  FT_UShort aw;
  FT_UShort ah;
  FT_Face pFStack_48;
  FT_Short dummy;
  TT_Face ttface;
  FT_GlyphSlot slot;
  FT_Error error;
  FT_UInt nn;
  FT_Fixed *advances_local;
  uint local_20;
  FT_Int32 flags_local;
  FT_UInt count_local;
  FT_UInt start_local;
  FT_Face face_local;
  
  slot._0_4_ = 0;
  ttface = (TT_Face)face->glyph;
  _error = advances;
  local_20 = count;
  flags_local = start;
  _count_local = face;
  if ((face->face_flags & 8U) != 0) {
    pFStack_48 = face;
    advances_local._4_4_ = flags;
    if ((flags & 0x10U) == 0) {
      if ((((face->face_index & 0x7fff0000U) != 0) || ((face->face_flags & 0x8000U) != 0)) &&
         (((ulong)face[4].extensions & 2) == 0)) {
        return 7;
      }
      if (*(short *)((long)&face[1].memory + 6) != 0) {
        for (slot._4_4_ = 0; slot._4_4_ < local_20; slot._4_4_ = slot._4_4_ + 1) {
          (**(code **)(*(long *)&pFStack_48[3].units_per_EM + 0x140))
                    (pFStack_48,0,flags_local + slot._4_4_,local_4a,&local_4e);
          _error[slot._4_4_] = (ulong)local_4e;
        }
        return (FT_Error)slot;
      }
    }
    else {
      if ((((face->face_index & 0x7fff0000U) != 0) || ((face->face_flags & 0x8000U) != 0)) &&
         (((ulong)face[4].extensions & 0x10) == 0)) {
        return 7;
      }
      if ((char)face[2].num_faces != '\0') {
        for (slot._4_4_ = 0; slot._4_4_ < local_20; slot._4_4_ = slot._4_4_ + 1) {
          (**(code **)(*(long *)&pFStack_48[3].units_per_EM + 0x140))
                    (pFStack_48,1,flags_local + slot._4_4_,local_4a,&local_4c);
          _error[slot._4_4_] = (ulong)local_4c;
        }
        return (FT_Error)slot;
      }
    }
  }
  advances_local._4_4_ = flags | 0x100;
  slot._4_4_ = 0;
  while ((slot._4_4_ < local_20 &&
         (slot._0_4_ = cff_glyph_load((FT_GlyphSlot)ttface,_count_local->size,
                                      flags_local + slot._4_4_,advances_local._4_4_),
         (FT_Error)slot == 0))) {
    if ((advances_local._4_4_ & 0x10) == 0) {
      local_58 = (ttface->root).bbox.yMin;
    }
    else {
      local_58 = (ttface->root).bbox.xMax;
    }
    _error[slot._4_4_] = local_58;
    slot._4_4_ = slot._4_4_ + 1;
  }
  return (FT_Error)slot;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  cff_get_advances( FT_Face    face,
                    FT_UInt    start,
                    FT_UInt    count,
                    FT_Int32   flags,
                    FT_Fixed*  advances )
  {
    FT_UInt       nn;
    FT_Error      error = FT_Err_Ok;
    FT_GlyphSlot  slot  = face->glyph;


    if ( FT_IS_SFNT( face ) )
    {
      /* OpenType 1.7 mandates that the data from `hmtx' table be used; */
      /* it is no longer necessary that those values are identical to   */
      /* the values in the `CFF' table                                  */

      TT_Face   ttface = (TT_Face)face;
      FT_Short  dummy;


      if ( flags & FT_LOAD_VERTICAL_LAYOUT )
      {
#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
        /* no fast retrieval for blended MM fonts without VVAR table */
        if ( ( FT_IS_NAMED_INSTANCE( face ) || FT_IS_VARIATION( face ) ) &&
             !( ttface->variation_support & TT_FACE_FLAG_VAR_VADVANCE )  )
          return FT_THROW( Unimplemented_Feature );
#endif

        /* check whether we have data from the `vmtx' table at all; */
        /* otherwise we extract the info from the CFF glyphstrings  */
        /* (instead of synthesizing a global value using the `OS/2' */
        /* table)                                                   */
        if ( !ttface->vertical_info )
          goto Missing_Table;

        for ( nn = 0; nn < count; nn++ )
        {
          FT_UShort  ah;


          ( (SFNT_Service)ttface->sfnt )->get_metrics( ttface,
                                                       1,
                                                       start + nn,
                                                       &dummy,
                                                       &ah );

          FT_TRACE5(( "  idx %d: advance height %d font unit%s\n",
                      start + nn,
                      ah,
                      ah == 1 ? "" : "s" ));
          advances[nn] = ah;
        }
      }
      else
      {
#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
        /* no fast retrieval for blended MM fonts without HVAR table */
        if ( ( FT_IS_NAMED_INSTANCE( face ) || FT_IS_VARIATION( face ) ) &&
             !( ttface->variation_support & TT_FACE_FLAG_VAR_HADVANCE )  )
          return FT_THROW( Unimplemented_Feature );
#endif

        /* check whether we have data from the `hmtx' table at all */
        if ( !ttface->horizontal.number_Of_HMetrics )
          goto Missing_Table;

        for ( nn = 0; nn < count; nn++ )
        {
          FT_UShort  aw;


          ( (SFNT_Service)ttface->sfnt )->get_metrics( ttface,
                                                       0,
                                                       start + nn,
                                                       &dummy,
                                                       &aw );

          FT_TRACE5(( "  idx %d: advance width %d font unit%s\n",
                      start + nn,
                      aw,
                      aw == 1 ? "" : "s" ));
          advances[nn] = aw;
        }
      }

      return error;
    }

  Missing_Table:
    flags |= (FT_UInt32)FT_LOAD_ADVANCE_ONLY;

    for ( nn = 0; nn < count; nn++ )
    {
      error = cff_glyph_load( slot, face->size, start + nn, flags );
      if ( error )
        break;

      advances[nn] = ( flags & FT_LOAD_VERTICAL_LAYOUT )
                     ? slot->linearVertAdvance
                     : slot->linearHoriAdvance;
    }

    return error;
  }